

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264.c
# Opt level: O3

int h264_prep_sgmap(h264_slice *slice)

{
  uint32_t uVar1;
  uint32_t uVar2;
  h264_picparm *phVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint32_t uVar8;
  int *piVar9;
  int iVar10;
  uint32_t uVar11;
  uint uVar12;
  uint32_t uVar13;
  int iVar14;
  ulong uVar15;
  uint32_t uVar16;
  ulong uVar17;
  int iVar18;
  uint32_t uVar19;
  int iVar20;
  uint uVar21;
  uint32_t uVar22;
  uint32_t uVar23;
  int iVar24;
  uint32_t uVar25;
  uint uVar26;
  uint32_t uVar27;
  uint32_t uVar28;
  bool bVar29;
  
  if (slice->sgmap == (int *)0x0) {
    phVar3 = slice->picparm;
    uVar1 = slice->seqparm->pic_width_in_mbs_minus1;
    uVar2 = slice->seqparm->pic_height_in_map_units_minus1;
    iVar14 = uVar1 + 1;
    iVar6 = uVar2 + 1;
    uVar13 = phVar3->num_slice_groups_minus1;
    uVar12 = iVar6 * iVar14;
    piVar9 = (int *)calloc(4,(long)(int)uVar12);
    slice->sgmap = piVar9;
    uVar21 = (phVar3->slice_group_change_rate_minus1 + 1) * slice->slice_group_change_cycle;
    if ((int)uVar12 <= (int)uVar21) {
      uVar21 = uVar12;
    }
    uVar5 = uVar12 - uVar21;
    if (phVar3->slice_group_change_direction_flag == 0) {
      uVar5 = uVar21;
    }
    if (0 < (int)uVar12) {
      iVar10 = uVar13 + 1;
      uVar26 = uVar13 - 1;
      uVar15 = 0;
      uVar17 = 0;
      uVar19 = 0;
      do {
        uVar4 = (ulong)(uint)((int)uVar15 >> 0x1f) << 0x20 | uVar15 & 0xffffffff;
        iVar24 = (int)uVar17;
        iVar18 = (int)((long)uVar4 % (long)iVar14);
        iVar20 = (int)((long)uVar4 / (long)iVar14);
        switch(phVar3->slice_group_map_type) {
        case 0:
          piVar9[uVar15] = iVar24;
          if (uVar19 == phVar3->run_length_minus1[iVar24]) {
            uVar19 = 0;
            uVar17 = (long)(iVar24 + 1) % (long)iVar10 & 0xffffffff;
          }
          else {
            uVar19 = uVar19 + 1;
          }
          break;
        case 1:
          piVar9[uVar15] = ((iVar20 * iVar10) / 2 + iVar18) % iVar10;
          break;
        case 2:
          piVar9[uVar15] = uVar13;
          uVar17 = (ulong)uVar26;
          if (-1 < (int)uVar26) {
            uVar7 = slice->pic_width_in_mbs;
            do {
              if (((((int)(phVar3->top_left[uVar17] % uVar7) <= iVar18) &&
                   (iVar20 <= (int)(phVar3->bottom_right[uVar17] / uVar7))) &&
                  ((int)(phVar3->top_left[uVar17] / uVar7) <= iVar20)) &&
                 (iVar18 <= (int)(phVar3->bottom_right[uVar17] % uVar7))) {
                piVar9[uVar15] = (int)uVar17;
              }
              bVar29 = 0 < (long)uVar17;
              uVar17 = uVar17 - 1;
            } while (bVar29);
            uVar17 = 0xffffffff;
          }
          break;
        case 3:
          piVar9[uVar15] = 1;
          break;
        case 4:
          uVar7 = (uint)((long)(int)uVar5 <= (long)uVar15) ^
                  phVar3->slice_group_change_direction_flag;
          goto LAB_00104ad6;
        case 5:
          uVar19 = iVar18 * iVar6 + iVar20;
          piVar9[uVar15] =
               (uint)((int)uVar5 <= (int)uVar19) ^ phVar3->slice_group_change_direction_flag;
          break;
        case 6:
          if (uVar12 != phVar3->pic_size_in_map_units_minus1 + 1) {
            h264_prep_sgmap_cold_1();
            return 1;
          }
          uVar7 = phVar3->slice_group_id[uVar15];
LAB_00104ad6:
          piVar9[uVar15] = uVar7;
          break;
        default:
          abort();
        }
        uVar15 = uVar15 + 1;
      } while (uVar15 != uVar12);
    }
    if (phVar3->slice_group_map_type == 3) {
      if ((int)uVar21 < 1) {
        return 0;
      }
      uVar25 = phVar3->slice_group_change_direction_flag;
      uVar13 = uVar25 - 1;
      uVar8 = (int)(iVar6 - uVar25) / 2;
      uVar11 = (int)(iVar14 - uVar25) / 2;
      uVar19 = uVar25 * 2 - 1;
      uVar16 = uVar25 * -2 + 1;
      iVar6 = 0;
      uVar22 = uVar11;
      uVar27 = uVar8;
      uVar23 = uVar11;
      uVar28 = uVar8;
      do {
        iVar24 = uVar27 * iVar14 + uVar23;
        iVar10 = piVar9[iVar24];
        piVar9[iVar24] = 0;
        if ((uVar13 == 0xffffffff) && (uVar23 == uVar22)) {
          uVar13 = 0;
          bVar29 = uVar22 == 0;
          uVar22 = uVar22 - 1;
          uVar25 = uVar19;
          uVar23 = uVar22;
          if (bVar29) {
            uVar22 = 0;
            uVar23 = 0;
          }
        }
        else if ((uVar13 == 1) && (uVar23 == uVar11)) {
          uVar11 = (uVar11 != uVar1) + uVar11;
          uVar25 = uVar16;
          uVar23 = uVar11;
          uVar13 = 0;
        }
        else if ((uVar25 == 0xffffffff) && (uVar27 == uVar8)) {
          bVar29 = uVar8 == 0;
          uVar8 = uVar8 - 1;
          uVar25 = 0;
          uVar27 = uVar8;
          uVar13 = uVar16;
          if (bVar29) {
            uVar8 = 0;
            uVar27 = 0;
          }
        }
        else if ((uVar25 == 1) && (uVar27 == uVar28)) {
          uVar28 = (uVar28 != uVar2) + uVar28;
          uVar25 = 0;
          uVar27 = uVar28;
          uVar13 = uVar19;
        }
        else {
          uVar27 = uVar27 + uVar25;
          uVar23 = uVar23 + uVar13;
        }
        iVar6 = iVar6 + iVar10;
      } while (iVar6 < (int)uVar21);
    }
  }
  return 0;
}

Assistant:

int h264_prep_sgmap(struct h264_slice *slice) {
	if (slice->sgmap)
		return 0;
	int width = slice->seqparm->pic_width_in_mbs_minus1 + 1;
	int height = slice->seqparm->pic_height_in_map_units_minus1 + 1;
	int i, j, k;
	int num = slice->picparm->num_slice_groups_minus1 + 1;
	slice->sgmap = calloc(sizeof *slice->sgmap, width * height);
	j = 0, k = 0;
	int musg0 = slice->slice_group_change_cycle * (slice->picparm->slice_group_change_rate_minus1 + 1);
	if (musg0 > width * height)
		musg0 = width * height;
	int sulg = musg0;
	if (slice->picparm->slice_group_change_direction_flag)
		sulg = width * height - sulg;
	for (i = 0; i < width * height; i++) {
		int x = i % width;
		int y = i / width;
		switch (slice->picparm->slice_group_map_type) {
			case H264_SLICE_GROUP_MAP_INTERLEAVED:
				slice->sgmap[i] = j;
				if (k == slice->picparm->run_length_minus1[j]) {
					k = 0;
					j++;
					j %= num;
				} else {
					k++;
				}
				break;
			case H264_SLICE_GROUP_MAP_DISPERSED:
				slice->sgmap[i] = (x + ((y * num) / 2)) % num;
				break;
			case H264_SLICE_GROUP_MAP_FOREGROUND:
				slice->sgmap[i] = num-1;
				for (j = num - 2; j >= 0; j--) {
					int xtl = slice->picparm->top_left[j] % slice->pic_width_in_mbs;
					int ytl = slice->picparm->top_left[j] / slice->pic_width_in_mbs;
					int xbr = slice->picparm->bottom_right[j] % slice->pic_width_in_mbs;
					int ybr = slice->picparm->bottom_right[j] / slice->pic_width_in_mbs;
					if (x >= xtl && x <= xbr && y >= ytl && y <= ybr)
						slice->sgmap[i] = j;
				}
				break;
			case H264_SLICE_GROUP_MAP_CHANGING_BOX:
				slice->sgmap[i] = 1;
				/* will be fixed below */
				break;
			case H264_SLICE_GROUP_MAP_CHANGING_VERTICAL:
				slice->sgmap[i] = slice->picparm->slice_group_change_direction_flag ^ (i >= sulg);
				break;
			case H264_SLICE_GROUP_MAP_CHANGING_HORIZONTAL:
				k = x * height + y;
				slice->sgmap[i] = slice->picparm->slice_group_change_direction_flag ^ (k >= sulg);
				break;
			case H264_SLICE_GROUP_MAP_EXPLICIT:
				if (width * height != slice->picparm->pic_size_in_map_units_minus1 + 1) {
					fprintf(stderr, "pic_size_in_map_units_minus1 mismatch!\n");
					return 1;
				}
				slice->sgmap[i] = slice->picparm->slice_group_id[i];
				break;
			default:
				abort();
		}
	}
	if (slice->picparm->slice_group_map_type == H264_SLICE_GROUP_MAP_CHANGING_BOX) {
		int cdf = slice->picparm->slice_group_change_direction_flag;
		int x = (width - cdf) / 2;
		int y = (height - cdf) / 2;
		int xmin = x, xmax = x;
		int ymin = y, ymax = y;
		int xdir = cdf - 1;
		int ydir = cdf;
		int muv;
		for (k = 0; k < musg0; k += muv) {
			muv = slice->sgmap[y * width + x];
			slice->sgmap[y * width + x] = 0;
			if (xdir == -1 && x == xmin) {
				if (xmin)
					xmin--;
				x = xmin;
				xdir = 0;
				ydir = 2 * cdf - 1;
			} else if (xdir == 1 && x == xmax) {
				if (xmax != width - 1)
					xmax++;
				x = xmax;
				xdir = 0;
				ydir = 1 - 2 * cdf;
			} else if (ydir == -1 && y == ymin) {
				if (ymin)
					ymin--;
				y = ymin;
				xdir = 1 - 2 * cdf;
				ydir = 0;
			} else if (ydir == 1 && y == ymax) {
				if (ymax != height - 1)
					ymax++;
				y = ymax;
				xdir = 2 * cdf - 1;
				ydir = 0;
			} else {
				x += xdir;
				y += ydir;
			}
		}
	}
	return 0;
}